

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidget::restoreGeometry(QWidget *this,QByteArray *geometry)

{
  QFlagsStorage<Qt::WindowState> newstate;
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  Representation RVar4;
  uint uVar5;
  QDataStream *pQVar6;
  QStyle *pQVar7;
  undefined8 uVar8;
  QSize QVar9;
  QTLWExtra *pQVar10;
  Representation RVar11;
  int extraout_EDX;
  bool bVar12;
  QRect *r;
  Representation RVar13;
  Representation RVar14;
  P _a;
  long lVar15;
  Representation RVar16;
  Representation RVar17;
  QScreen *pQVar18;
  long lVar19;
  long in_FS_OFFSET;
  double dVar20;
  QArrayDataPointer<QScreen_*> local_c8;
  qint32 restoredScreenWidth;
  quint8 fullScreen;
  quint8 maximized;
  qint32 restoredScreenNumber;
  QRect local_98;
  QRect local_88;
  QRect local_78;
  quint16 minorVersion;
  quint16 majorVersion;
  quint32 storedMagicNumber;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(geometry->d).size < 4) {
    bVar12 = false;
    goto LAB_002fcdc6;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,geometry);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,7);
  storedMagicNumber = 0xaaaaaaaa;
  QDataStream::operator>>((QDataStream *)&local_58,(int *)&storedMagicNumber);
  if (storedMagicNumber == 0x1d9d0cb) {
    majorVersion = 0;
    minorVersion = 0;
    pQVar6 = (QDataStream *)QDataStream::operator>>((QDataStream *)&local_58,(short *)&majorVersion)
    ;
    QDataStream::operator>>(pQVar6,(short *)&minorVersion);
    if (3 < majorVersion) goto LAB_002fcdba;
    local_78.x1.m_i = 0;
    local_78.y1.m_i = 0;
    local_78.x2.m_i = -1;
    local_78.y2.m_i = -1;
    local_88.x1.m_i = 0;
    local_88.y1.m_i = 0;
    local_88.x2.m_i = -1;
    local_88.y2.m_i = -1;
    local_98.x1.m_i = 0;
    local_98.y1.m_i = 0;
    local_98.x2.m_i = -1;
    local_98.y2.m_i = -1;
    restoredScreenNumber = -0x55555556;
    maximized = 0xaa;
    fullScreen = 0xaa;
    restoredScreenWidth = 0;
    pQVar6 = (QDataStream *)::operator>>((QDataStream *)&local_58,&local_78);
    pQVar6 = (QDataStream *)::operator>>(pQVar6,&local_98);
    pQVar6 = (QDataStream *)QDataStream::operator>>(pQVar6,&restoredScreenNumber);
    pQVar6 = (QDataStream *)QDataStream::operator>>(pQVar6,&maximized);
    QDataStream::operator>>(pQVar6,&fullScreen);
    if ((1 < majorVersion) &&
       (QDataStream::operator>>((QDataStream *)&local_58,&restoredScreenWidth), 2 < majorVersion)) {
      ::operator>>((QDataStream *)&local_58,&local_88);
    }
    lVar19 = (long)restoredScreenNumber;
    QGuiApplication::screens();
    lVar15 = local_c8.size + (ulong)(local_c8.size == 0);
    QArrayDataPointer<QScreen_*>::~QArrayDataPointer(&local_c8);
    if (lVar15 <= lVar19) {
      restoredScreenNumber = 0;
    }
    QGuiApplication::screens();
    if ((ulong)(long)restoredScreenNumber < (ulong)local_c8.size) {
      pQVar18 = local_c8.ptr[restoredScreenNumber];
    }
    else {
      pQVar18 = (QScreen *)0x0;
    }
    QArrayDataPointer<QScreen_*>::~QArrayDataPointer(&local_c8);
    if (pQVar18 == (QScreen *)0x0) {
      dVar20 = 0.0;
    }
    else {
      iVar2 = QScreen::geometry();
      dVar20 = (double)((extraout_EDX - iVar2) + 1);
    }
    auVar1._8_8_ = local_c8.ptr;
    auVar1._0_8_ = local_c8.d;
    if (restoredScreenWidth == 0) {
      if (fullScreen == '\0' && maximized == '\0') {
        if (1.5 < (double)((local_78.x2.m_i - local_78.x1.m_i) + 1) / dVar20) goto LAB_002fcdba;
      }
LAB_002fcf6d:
      pQVar7 = QApplication::style();
      if (pQVar7 == (QStyle *)0x0) {
        uVar3 = 0x14;
      }
      else {
        pQVar7 = QApplication::style();
        uVar3 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1a,0,this);
      }
      RVar4.m_i = local_98.y1.m_i;
      RVar13.m_i = local_98.x2.m_i;
      RVar16.m_i = local_98.y2.m_i;
      RVar11.m_i = local_98.x1.m_i;
      if (local_98.x2.m_i < local_98.x1.m_i || local_98.y2.m_i < local_98.y1.m_i) {
        uVar8 = (**(code **)(*(long *)this + 0x70))(this);
        RVar13.m_i = (int)uVar8 + -1;
        RVar16.m_i = uVar3 + (int)((ulong)uVar8 >> 0x20) + -1;
        local_98._0_8_ = (ulong)uVar3 << 0x20;
        local_98.y2.m_i = RVar16.m_i;
        local_98.x2.m_i = RVar13.m_i;
        RVar11.m_i = 0;
        RVar4.m_i = uVar3;
      }
      if ((RVar13.m_i < RVar11.m_i) || (RVar16.m_i < RVar4.m_i)) {
        RVar14.m_i = (RVar13.m_i - RVar11.m_i) + 1;
        RVar17.m_i = (RVar16.m_i - RVar4.m_i) + 1;
        QVar9 = QWidgetPrivate::adjustedSize(*(QWidgetPrivate **)&this->field_0x8);
        if (RVar14.m_i <= QVar9.wd.m_i.m_i) {
          RVar14.m_i = QVar9.wd.m_i.m_i;
        }
        if (RVar17.m_i <= QVar9.ht.m_i.m_i) {
          RVar17.m_i = QVar9.ht.m_i.m_i;
        }
        local_98.y2.m_i = local_98.y1.m_i + RVar17.m_i + -1;
        local_98.x2.m_i = local_98.x1.m_i + -1 + RVar14.m_i;
      }
      local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.ptr = (QScreen **)&DAT_aaaaaaaaaaaaaaaa;
      if (pQVar18 == (QScreen *)0x0) {
        local_c8._0_16_ = ZEXT816(0xffffffffffffffff) << 0x40;
      }
      else {
        local_c8._0_16_ = QScreen::availableGeometry();
      }
      QWidgetPrivate::checkRestoredGeometry((QRect *)&local_c8,&local_88,uVar3);
      QWidgetPrivate::checkRestoredGeometry((QRect *)&local_c8,&local_98,uVar3);
      uVar3 = *(uint *)&this->data->field_0x10;
      if (fullScreen == '\0' && maximized == '\0') {
        setWindowState(this,(WindowStates)(uVar3 & 9));
        if (majorVersion < 3) {
          r = &local_98;
        }
        else {
          r = &local_88;
        }
        setGeometry(this,r);
      }
      else {
        uVar3 = uVar3 & 0xf;
        setGeometry(this,&local_98);
        uVar5 = uVar3 | 2;
        if (maximized == '\0') {
          uVar5 = uVar3;
        }
        newstate.i = uVar5 | 4;
        if (fullScreen == '\0') {
          newstate.i = uVar5;
        }
        setWindowState(this,(WindowStates)newstate.i);
        pQVar10 = QWidgetPrivate::topData(*(QWidgetPrivate **)&this->field_0x8);
        (pQVar10->normalGeometry).x1 = (Representation)local_98.x1.m_i;
        (pQVar10->normalGeometry).y1 = (Representation)local_98.y1.m_i;
        (pQVar10->normalGeometry).x2 = (Representation)local_98.x2.m_i;
        (pQVar10->normalGeometry).y2 = (Representation)local_98.y2.m_i;
      }
      bVar12 = true;
    }
    else {
      bVar12 = false;
      if ((0.8 <= (double)restoredScreenWidth / dVar20) &&
         (bVar12 = false, local_c8._0_16_ = auVar1, (double)restoredScreenWidth / dVar20 <= 1.25))
      goto LAB_002fcf6d;
    }
  }
  else {
LAB_002fcdba:
    bVar12 = false;
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
LAB_002fcdc6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar12;
}

Assistant:

bool QWidget::restoreGeometry(const QByteArray &geometry)
{
    if (geometry.size() < 4)
        return false;
    QDataStream stream(geometry);
    stream.setVersion(QDataStream::Qt_4_0);

    const quint32 magicNumber = 0x1D9D0CB;
    quint32 storedMagicNumber;
    stream >> storedMagicNumber;
    if (storedMagicNumber != magicNumber)
        return false;

    const quint16 currentMajorVersion = 3;
    quint16 majorVersion = 0;
    quint16 minorVersion = 0;

    stream >> majorVersion >> minorVersion;

    if (majorVersion > currentMajorVersion)
        return false;
    // (Allow all minor versions.)

    QRect restoredFrameGeometry;
    QRect restoredGeometry;
    QRect restoredNormalGeometry;
    qint32 restoredScreenNumber;
    quint8 maximized;
    quint8 fullScreen;
    qint32 restoredScreenWidth = 0;

    stream >> restoredFrameGeometry // Only used for sanity checks in version 0
           >> restoredNormalGeometry
           >> restoredScreenNumber
           >> maximized
           >> fullScreen;

    if (majorVersion > 1)
        stream >> restoredScreenWidth;
    if (majorVersion > 2)
        stream >> restoredGeometry;

    // ### Qt 6 - Perhaps it makes sense to dumb down the restoreGeometry() logic, see QTBUG-69104

    if (restoredScreenNumber >= qMax(QGuiApplication::screens().size(), 1))
        restoredScreenNumber = 0;
    const QScreen *restoredScreen = QGuiApplication::screens().value(restoredScreenNumber, nullptr);
    const qreal screenWidthF = restoredScreen ? qreal(restoredScreen->geometry().width()) : 0;
    // Sanity check bailing out when large variations of screen sizes occur due to
    // high DPI scaling or different levels of DPI awareness.
    if (restoredScreenWidth) {
        const qreal factor = qreal(restoredScreenWidth) / screenWidthF;
        if (factor < 0.8 || factor > 1.25)
            return false;
    } else {
        // Saved by Qt 5.3 and earlier, try to prevent too large windows
        // unless the size will be adapted by maximized or fullscreen.
        if (!maximized && !fullScreen && qreal(restoredFrameGeometry.width()) / screenWidthF > 1.5)
            return false;
    }

    const int frameHeight = QApplication::style()
                          ? QApplication::style()->pixelMetric(QStyle::PM_TitleBarHeight, nullptr, this)
                          : 20;

    if (!restoredNormalGeometry.isValid())
        restoredNormalGeometry = QRect(QPoint(0, frameHeight), sizeHint());
    if (!restoredNormalGeometry.isValid()) {
        // use the widget's adjustedSize if the sizeHint() doesn't help
        restoredNormalGeometry.setSize(restoredNormalGeometry
                                       .size()
                                       .expandedTo(d_func()->adjustedSize()));
    }

    const QRect availableGeometry = restoredScreen ? restoredScreen->availableGeometry()
                                                   : QRect();

    // Modify the restored geometry if we are about to restore to coordinates
    // that would make the window "lost". This happens if:
    // - The restored geometry is completely or partly oustside the available geometry
    // - The title bar is outside the available geometry.

    QWidgetPrivate::checkRestoredGeometry(availableGeometry, &restoredGeometry, frameHeight);
    QWidgetPrivate::checkRestoredGeometry(availableGeometry, &restoredNormalGeometry, frameHeight);

    if (maximized || fullScreen) {
        // set geometry before setting the window state to make
        // sure the window is maximized to the right screen.
        Qt::WindowStates ws = windowState();
#ifndef Q_OS_WIN
        setGeometry(restoredNormalGeometry);
#else
        if (ws & Qt::WindowFullScreen) {
            // Full screen is not a real window state on Windows.
            move(availableGeometry.topLeft());
        } else if (ws & Qt::WindowMaximized) {
            // Setting a geometry on an already maximized window causes this to be
            // restored into a broken, half-maximized state, non-resizable state (QTBUG-4397).
            // Move the window in normal state if needed.
            if (restoredScreen != screen()) {
                setWindowState(Qt::WindowNoState);
                setGeometry(restoredNormalGeometry);
            }
        } else {
            setGeometry(restoredNormalGeometry);
        }
#endif // Q_OS_WIN
        if (maximized)
            ws |= Qt::WindowMaximized;
        if (fullScreen)
            ws |= Qt::WindowFullScreen;
       setWindowState(ws);
       d_func()->topData()->normalGeometry = restoredNormalGeometry;
    } else {
        setWindowState(windowState() & ~(Qt::WindowMaximized | Qt::WindowFullScreen));

        // FIXME: Why fall back to restoredNormalGeometry if majorVersion <= 2?
        if (majorVersion > 2)
            setGeometry(restoredGeometry);
        else
            setGeometry(restoredNormalGeometry);
    }
    return true;
}